

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O3

VkResult Fossilize::CreateRayTracingPipelinesKHR
                   (VkDevice device,VkDeferredOperationKHR deferredOperation,
                   VkPipelineCache pipelineCache,uint32_t createInfoCount,
                   VkRayTracingPipelineCreateInfoKHR *pCreateInfos,VkAllocationCallbacks *pAllocator
                   ,VkPipeline *pPipelines)

{
  int *piVar1;
  byte *pbVar2;
  Instance *pIVar3;
  undefined4 uVar4;
  bool bVar5;
  VkResult VVar6;
  VkResult VVar7;
  LogLevel LVar8;
  VkBaseInStructure *s_1;
  Device *this;
  VkRayTracingPipelineCreateInfoKHR *pVVar9;
  int *piVar10;
  PFN_vkGetShaderModuleCreateInfoIdentifierEXT p_Var11;
  uint uVar12;
  long lVar13;
  uint32_t i;
  ulong uVar14;
  VkPipeline *ppVVar15;
  int *piVar16;
  VkPipeline pipeline;
  ulong uVar17;
  VkRayTracingPipelineCreateInfoKHR *pVVar18;
  uint32_t i_1;
  long lVar19;
  ulong uVar20;
  bool bVar21;
  byte bVar22;
  VkRayTracingPipelineCreateInfoKHR local_98;
  
  bVar22 = 0;
  this = get_device_layer(*(VkDevice *)device);
  pIVar3 = this->pInstance;
  if ((pIVar3->enableCrashHandler == false) && ((pIVar3->synchronized & 1U) == 0)) {
    if ((createInfoCount == 0) || (pIVar3->enablePrecompileQA == false)) {
      bVar5 = true;
    }
    else {
      uVar17 = (ulong)createInfoCount;
      uVar20 = 0;
      do {
        uVar12 = pCreateInfos[uVar20].flags;
        piVar10 = (int *)pCreateInfos[uVar20].pNext;
        for (piVar16 = piVar10; piVar16 != (int *)0x0; piVar16 = *(int **)(piVar16 + 2)) {
          if (*piVar16 == 0x3ba1f5f5) {
            uVar12 = (uint)*(undefined8 *)(piVar16 + 4);
            break;
          }
        }
        piVar16 = piVar10;
        if (piVar10 != (int *)0x0) {
          do {
            if (*piVar16 == 0x3b9f36d0) goto LAB_00117018;
            piVar1 = piVar16 + 2;
            piVar16 = *(int **)piVar1;
          } while (*(int **)piVar1 != (int *)0x0);
          piVar16 = (int *)0x0;
LAB_00117018:
          do {
            if (*piVar10 == 0x3ba228ba) {
              if (piVar10[4] != 0) goto LAB_001174b1;
              break;
            }
            piVar10 = *(int **)(piVar10 + 2);
          } while (piVar10 != (int *)0x0);
          if (piVar16 == (int *)0x0) goto LAB_0011705f;
          if ((uVar12 >> 10 & 1) != 0 || piVar16[4] == 0) {
            uVar12 = uVar12 & 0x100;
            goto joined_r0x00117058;
          }
LAB_001174b1:
          bVar5 = true;
          goto LAB_00117617;
        }
LAB_0011705f:
        uVar12 = uVar12 >> 8 & 1;
joined_r0x00117058:
        if (uVar12 != 0) goto LAB_001174b1;
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar17);
      ScratchAllocator::ScratchAllocator((ScratchAllocator *)&local_98);
      pVVar9 = (VkRayTracingPipelineCreateInfoKHR *)
               ScratchAllocator::allocate_raw((ScratchAllocator *)&local_98,uVar17 * 0x68,0x10);
      memcpy(pVVar9,pCreateInfos,uVar17 * 0x68);
      uVar20 = 0;
      do {
        pbVar2 = (byte *)((long)&pVVar9[uVar20].flags + 1);
        *pbVar2 = *pbVar2 | 1;
        bVar5 = shallowCopyPnextChain
                          ((ScratchAllocator *)&local_98,pVVar9[uVar20].pNext,&pVVar9[uVar20].pNext)
        ;
        if (!bVar5) {
          bVar21 = false;
          goto LAB_00117569;
        }
        for (piVar10 = (int *)pVVar9[uVar20].pNext; piVar10 != (int *)0x0;
            piVar10 = *(int **)(piVar10 + 2)) {
          if (*piVar10 == 0x3ba1f5f5) {
            *(byte *)((long)piVar10 + 0x11) = *(byte *)((long)piVar10 + 0x11) | 1;
            break;
          }
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar17);
      VVar6 = (*this->pTable->CreateRayTracingPipelinesKHR)
                        (device,(VkDeferredOperationKHR)0x0,(VkPipelineCache)0x0,createInfoCount,
                         pVVar9,pAllocator,pPipelines);
      if (VVar6 == VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT) {
        uVar20 = 0;
        do {
          if (pPipelines[uVar20] == (VkPipeline)0x0) {
            for (piVar10 = (int *)pCreateInfos[uVar20].pNext; piVar10 != (int *)0x0;
                piVar10 = *(int **)(piVar10 + 2)) {
              if (*piVar10 == 0x3ba1f5f5) {
                uVar14 = *(ulong *)(piVar10 + 4);
                goto LAB_0011719d;
              }
            }
            uVar14 = (ulong)pCreateInfos[uVar20].flags;
LAB_0011719d:
            LVar8 = get_thread_log_level();
            if ((int)LVar8 < 2) {
              bVar5 = Internal::log_thread_callback
                                (LOG_DEFAULT,
                                 "QA: Pipeline compilation required for pipeline, flags %08x\'%08x.\n"
                                 ,uVar14 >> 0x20,uVar14 & 0xffffffff);
              if (!bVar5) {
                fprintf(_stderr,
                        "Fossilize WARN: QA: Pipeline compilation required for pipeline, flags %08x\'%08x.\n"
                        ,uVar14 >> 0x20,uVar14 & 0xffffffff);
              }
            }
            Device::registerPrecompileQAFailure(this,1);
            if (this->usesModuleIdentifiers == true) {
              p_Var11 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
            }
            else {
              p_Var11 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
            }
            bVar5 = StateRecorder::record_raytracing_pipeline
                              (this->recorder,pPipelines[uVar20],pCreateInfos + uVar20,pPipelines,
                               createInfoCount,0,device,p_Var11);
            if (((!bVar5) && (LVar8 = get_thread_log_level(), (int)LVar8 < 2)) &&
               (bVar5 = Internal::log_thread_callback
                                  (LOG_DEFAULT,
                                   "Recording graphics pipeline failed, usually caused by unsupported pNext.\n"
                                  ), !bVar5)) {
              CreateRayTracingPipelinesKHR();
            }
          }
          else {
            Device::registerPrecompileQASuccess(this,1);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar17);
        uVar20 = 0;
        do {
          (*this->pTable->DestroyPipeline)(this->device,pPipelines[uVar20],pAllocator);
          pPipelines[uVar20] = (VkPipeline)0x0;
          uVar20 = uVar20 + 1;
        } while (uVar17 != uVar20);
        bVar21 = false;
      }
      else {
        Device::registerPrecompileQASuccess(this,createInfoCount);
        bVar21 = VVar6 == VK_SUCCESS;
      }
LAB_00117569:
      ScratchAllocator::~ScratchAllocator((ScratchAllocator *)&local_98);
      bVar5 = true;
      uVar20 = 0;
      do {
        uVar12 = pCreateInfos[uVar20].flags;
        for (piVar10 = (int *)pCreateInfos[uVar20].pNext; piVar10 != (int *)0x0;
            piVar10 = *(int **)(piVar10 + 2)) {
          if (*piVar10 == 0x3ba1f5f5) {
            uVar12 = (uint)*(undefined8 *)(piVar10 + 4);
            break;
          }
        }
        if ((uVar12 >> 0xb & 1) != 0) break;
        uVar20 = uVar20 + 1;
        bVar5 = uVar20 < uVar17;
      } while (uVar20 != uVar17);
      if (bVar21 && deferredOperation != (VkDeferredOperationKHR)0x0) {
        uVar20 = 0;
        do {
          (*this->pTable->DestroyPipeline)(device,pPipelines[uVar20],pAllocator);
          pPipelines[uVar20] = (VkPipeline)0x0;
          uVar20 = uVar20 + 1;
        } while (uVar17 != uVar20);
      }
    }
LAB_00117617:
    VVar7 = (*this->pTable->CreateRayTracingPipelinesKHR)
                      (device,deferredOperation,pipelineCache,createInfoCount,pCreateInfos,
                       pAllocator,pPipelines);
    if ((((uint)(VVar7 + ~VK_THREAD_DONE_KHR) < 2) || (VVar7 == VK_SUCCESS)) &&
       (!(bool)(~bVar5 & 1) && createInfoCount != 0)) {
      uVar20 = 0;
      do {
        if (this->usesModuleIdentifiers == true) {
          p_Var11 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
        }
        else {
          p_Var11 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
        }
        bVar5 = StateRecorder::record_raytracing_pipeline
                          (this->recorder,pPipelines[uVar20],pCreateInfos,pPipelines,createInfoCount
                           ,0,device,p_Var11);
        if (((!bVar5) && (LVar8 = get_thread_log_level(), (int)LVar8 < 2)) &&
           (bVar5 = Internal::log_thread_callback
                              (LOG_DEFAULT,
                               "Failed to record compute pipeline, usually caused by unsupported pNext.\n"
                              ), !bVar5)) {
          CreateRayTracingPipelinesKHR();
        }
        uVar20 = uVar20 + 1;
        pCreateInfos = pCreateInfos + 1;
      } while (createInfoCount != uVar20);
    }
  }
  else {
    if (createInfoCount == 0) {
      VVar6 = VK_SUCCESS;
    }
    else {
      memset(pPipelines,0,(ulong)createInfoCount * 8);
      lVar19 = 0;
      VVar6 = VK_SUCCESS;
      ppVVar15 = pPipelines;
      do {
        pVVar9 = pCreateInfos;
        pVVar18 = &local_98;
        for (lVar13 = 0xd; lVar13 != 0; lVar13 = lVar13 + -1) {
          uVar4 = *(undefined4 *)&pVVar9->field_0x4;
          pVVar18->sType = pVVar9->sType;
          *(undefined4 *)&pVVar18->field_0x4 = uVar4;
          pVVar9 = (VkRayTracingPipelineCreateInfoKHR *)((long)pVVar9 + (ulong)bVar22 * -0x10 + 8);
          pVVar18 = (VkRayTracingPipelineCreateInfoKHR *)
                    ((long)pVVar18 + ((ulong)bVar22 * -2 + 1) * 8);
        }
        if ((-1 < local_98.basePipelineIndex &
            local_98.basePipelineHandle == (VkPipeline)0x0 & (byte)local_98.flags >> 2) == 1) {
          local_98.basePipelineHandle = pPipelines[(uint)local_98.basePipelineIndex];
          local_98.basePipelineIndex = 0xffffffff;
        }
        if (this->pInstance->synchronized == true) {
          if (this->usesModuleIdentifiers == true) {
            p_Var11 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
          }
          else {
            p_Var11 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
          }
          bVar5 = StateRecorder::record_raytracing_pipeline
                            (this->recorder,(VkPipeline)0x0,&local_98,(VkPipeline *)0x0,0,0,device,
                             p_Var11);
          if (((!bVar5) && (LVar8 = get_thread_log_level(), (int)LVar8 < 2)) &&
             (bVar5 = Internal::log_thread_callback(LOG_DEFAULT,"Failed to capture eagerly.\n"),
             !bVar5)) {
            CreateRayTracingPipelinesKHR();
          }
        }
        Instance::braceForRayTracingPipelineCrash(this->recorder,&local_98);
        VVar7 = (*this->pTable->CreateRayTracingPipelinesKHR)
                          (device,(VkDeferredOperationKHR)0x0,pipelineCache,1,&local_98,pAllocator,
                           ppVVar15);
        Instance::completedPipelineCompilation();
        pipeline = (VkPipeline)0x0;
        if (VVar7 == VK_SUCCESS) {
          pipeline = *ppVVar15;
        }
        if (this->usesModuleIdentifiers == true) {
          p_Var11 = this->pTable->GetShaderModuleCreateInfoIdentifierEXT;
        }
        else {
          p_Var11 = (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0;
        }
        bVar5 = StateRecorder::record_raytracing_pipeline
                          (this->recorder,pipeline,&local_98,(VkPipeline *)0x0,0,0,device,p_Var11);
        if (((!bVar5) && (LVar8 = get_thread_log_level(), (int)LVar8 < 2)) &&
           (bVar5 = Internal::log_thread_callback
                              (LOG_DEFAULT,
                               "Failed to record compute pipeline, usually caused by unsupported pNext.\n"
                              ), !bVar5)) {
          CreateRayTracingPipelinesKHR();
        }
        if (VVar7 == VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT) {
          VVar6 = VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT;
        }
        if (VVar7 < VK_SUCCESS) {
          if (lVar19 == 0) {
            return VVar7;
          }
          lVar13 = 0;
          do {
            (*this->pTable->DestroyPipeline)(device,pPipelines[lVar13],pAllocator);
            lVar13 = lVar13 + 1;
          } while (-lVar13 != lVar19);
          return VVar7;
        }
        if ((VVar7 == VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT) && ((local_98.flags._1_1_ & 2) != 0))
        {
          return VK_ERROR_PIPELINE_COMPILE_REQUIRED_EXT;
        }
        lVar19 = lVar19 + -1;
        ppVVar15 = ppVVar15 + 1;
        pCreateInfos = pCreateInfos + 1;
      } while (-(ulong)createInfoCount != lVar19);
    }
    VVar7 = VK_OPERATION_NOT_DEFERRED_KHR;
    if (VVar6 != VK_SUCCESS) {
      VVar7 = VVar6;
    }
    if (deferredOperation == (VkDeferredOperationKHR)0x0) {
      VVar7 = VVar6;
    }
  }
  return VVar7;
}

Assistant:

static VKAPI_ATTR VkResult VKAPI_CALL CreateRayTracingPipelinesKHR(
		VkDevice device, VkDeferredOperationKHR deferredOperation,
		VkPipelineCache pipelineCache, uint32_t createInfoCount,
		const VkRayTracingPipelineCreateInfoKHR *pCreateInfos,
		const VkAllocationCallbacks *pAllocator,
		VkPipeline *pPipelines)
{
	auto *layer = get_device_layer(device);

	if (layer->getInstance()->capturesParanoid())
	{
		return CreateRayTracingPipelinesParanoid(layer, device, deferredOperation, pipelineCache,
		                                         createInfoCount, pCreateInfos, pAllocator, pPipelines);
	}
	else
	{
		return CreateRayTracingPipelinesNormal(layer, device, deferredOperation, pipelineCache,
		                                       createInfoCount, pCreateInfos, pAllocator, pPipelines);
	}
}